

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O3

size_t nni_aio_iov_advance(nni_aio *aio,size_t n)

{
  uint *puVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  nni_iov *pnVar5;
  ulong uVar6;
  size_t sVar7;
  
  if (n == 0) {
LAB_00112770:
    sVar7 = 0;
  }
  else {
    uVar4 = (ulong)aio->a_nio;
    sVar7 = n;
    do {
      if ((int)uVar4 == 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                  0x2e4,"aio->a_nio != 0");
      }
      uVar2 = aio->a_iov[0].iov_len;
      if (n <= uVar2 && uVar2 - n != 0) {
        aio->a_iov[0].iov_len = uVar2 - n;
        aio->a_iov[0].iov_buf = (void *)((long)aio->a_iov[0].iov_buf + n);
        goto LAB_00112770;
      }
      puVar1 = &aio->a_nio;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        uVar4 = 0;
      }
      else {
        uVar6 = 0;
        pnVar5 = aio->a_iov;
        do {
          pnVar5 = pnVar5 + 1;
          uVar6 = uVar6 + 1;
          sVar3 = pnVar5->iov_len;
          pnVar5[-1].iov_buf = pnVar5->iov_buf;
          pnVar5[-1].iov_len = sVar3;
          uVar4 = (ulong)aio->a_nio;
        } while (uVar6 < uVar4);
      }
      sVar7 = sVar7 - uVar2;
      n = n - uVar2;
      aio->a_iov[uVar4].iov_buf = (void *)0x0;
      aio->a_iov[uVar4].iov_len = 0;
    } while (n != 0);
  }
  return sVar7;
}

Assistant:

size_t
nni_aio_iov_advance(nni_aio *aio, size_t n)
{
	size_t residual = n;
	while (n) {
		NNI_ASSERT(aio->a_nio != 0);
		if (aio->a_iov[0].iov_len > n) {
			aio->a_iov[0].iov_len -= n;
			NNI_INCPTR(aio->a_iov[0].iov_buf, n);
			return (0); // we used all of "n"
		}
		residual -= aio->a_iov[0].iov_len;
		n -= aio->a_iov[0].iov_len;
		aio->a_nio--;
		for (unsigned i = 0; i < aio->a_nio; i++) {
			aio->a_iov[i] = aio->a_iov[i + 1];
		}
		aio->a_iov[aio->a_nio].iov_buf = NULL; // serves as indicator
		aio->a_iov[aio->a_nio].iov_len = 0;    // serves as indicator
	}
	return (residual); // we might not have used all of n for this iov
}